

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Get_proc_index(int g_a,int iproc,int *index)

{
  Integer IVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  Integer _ga_work [7];
  Integer local_58 [7];
  
  IVar1 = pnga_get_dimension((long)g_a);
  pnga_get_proc_index((long)g_a,(long)iproc,local_58);
  lVar2 = 0;
  lVar3 = 0;
  if (0 < IVar1) {
    lVar3 = IVar1;
  }
  piVar4 = index + IVar1;
  for (; piVar4 = piVar4 + -1, lVar3 != lVar2; lVar2 = lVar2 + 1) {
    *piVar4 = (int)local_58[lVar2];
  }
  return;
}

Assistant:

void NGA_Get_proc_index(int g_a, int iproc, int index[])
{
     Integer aa, proc, ndim;
     Integer _ga_work[MAXDIM];
     aa = (Integer)g_a;
     proc = (Integer)iproc;
     ndim = wnga_get_dimension(aa);
     wnga_get_proc_index(aa, proc, _ga_work);
     COPYF2C(_ga_work,index, ndim);
}